

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.cpp
# Opt level: O0

Span * __thiscall SpanList::newSpan(SpanList *this,SpanMap *spanMap)

{
  int sc;
  Span *this_00;
  mapped_type *ppSVar1;
  Span *local_40 [3];
  Span *local_28;
  Span *span;
  void *addr;
  SpanMap *spanMap_local;
  SpanList *this_local;
  
  addr = spanMap;
  spanMap_local = (SpanMap *)this;
  span = (Span *)mmap((void *)0x0,(long)spanInfo[this->spanClass][2],3,0x21,0,0);
  this_00 = (Span *)operator_new(0x40);
  sc = this->spanClass;
  Span::Span(this_00,span,spanInfo[sc][2],spanInfo[sc][3],0,sc,spanInfo[sc][1]);
  local_40[0] = span;
  local_28 = this_00;
  ppSVar1 = std::
            map<bool_*,_Span_*,_std::greater<bool_*>,_std::allocator<std::pair<bool_*const,_Span_*>_>_>
            ::operator[]((map<bool_*,_Span_*,_std::greater<bool_*>,_std::allocator<std::pair<bool_*const,_Span_*>_>_>
                          *)addr,(key_type *)local_40);
  *ppSVar1 = this_00;
  local_28->prev = local_28;
  local_28->next = local_28;
  return local_28;
}

Assistant:

Span *SpanList::newSpan(SpanMap *spanMap) {
  // 没有 span了, 则调用mmap分配一个
  auto addr =
      mmap(NULL,                   //分配的首地址
           spanInfo[spanClass][2], //分配内存大小(必须是页的整数倍, 32位1页=4k)
           PROT_READ | PROT_WRITE, //映射区域保护权限：读|写
           MAP_ANON | MAP_SHARED, //匿名映射(不涉及文件io), 后面两个参数忽略
           0,                     //要映射到内存中的文件描述符
           0 //文件映射的偏移量，通常设置为0，必须是页的整数倍
      );
  // ! 产生 span的地方, 需要添加到 spanMap结构中
  Span *span = new Span(addr, spanInfo[spanClass][2], spanInfo[spanClass][3], 0,
                        spanClass, spanInfo[spanClass][1]);
  (*spanMap)[(bool *)addr] = span;
  span->prev = span;
  span->next = span;
  return span;
}